

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

uncertain_measurement
units::uncertain_measurement_from_string(string *measurement_string,uint64_t match_flags)

{
  bool bVar1;
  const_reference pvVar2;
  reference pvVar3;
  double val;
  double uncertainty_val;
  measurement mVar4;
  measurement mVar5;
  measurement u1;
  measurement m1_1;
  string p;
  string ustring;
  char c;
  size_type lc;
  int cloc;
  size_type diff;
  size_type eloc;
  size_type loc;
  measurement m2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> p2;
  measurement m1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> p1;
  size_type loc_1;
  char *pmseq;
  const_iterator __end1;
  const_iterator __begin1;
  array<const_char_*,_9UL> *__range1;
  undefined7 in_stack_fffffffffffffd08;
  char in_stack_fffffffffffffd0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  measurement *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  measurement *in_stack_fffffffffffffd38;
  uncertain_measurement *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  value_type in_stack_fffffffffffffd57;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  string *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  measurement local_200;
  measurement local_1d0;
  measurement local_1a0;
  char local_149;
  ulong local_148;
  int local_13c;
  ulong local_138;
  size_type local_130;
  size_type local_128;
  unit local_11c;
  undefined4 local_114;
  unit local_110;
  unit local_108;
  unit local_100;
  measurement local_d8 [6];
  measurement local_78 [3];
  size_type local_48;
  value_type local_40;
  const_iterator local_38;
  const_iterator local_30;
  array<const_char_*,_9UL> *local_28;
  uncertain_measurement local_10;
  
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6dbe34);
  if (bVar1) {
    memset(&local_10,0,0x10);
    uncertain_measurement::uncertain_measurement((uncertain_measurement *)0x6dbe5b);
  }
  else {
    local_28 = &uncertain_measurement_from_string::pmsequences;
    local_30 = std::array<const_char_*,_9UL>::begin((array<const_char_*,_9UL> *)0x6dbe7b);
    local_38 = std::array<const_char_*,_9UL>::end((array<const_char_*,_9UL> *)0x6dbe8f);
    for (; local_30 != local_38; local_30 = local_30 + 1) {
      local_40 = *local_30;
      local_48 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                           (in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
                            (size_type)in_stack_fffffffffffffd20);
      if (local_48 != 0xffffffffffffffff) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20,
                   (size_type)in_stack_fffffffffffffd18);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd48);
        local_78[0] = measurement_cast_from_string
                                (in_stack_fffffffffffffd70,
                                 CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        std::__cxx11::string::~string(in_stack_fffffffffffffd10);
        strlen(local_40);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffd28,(size_type)in_stack_fffffffffffffd20,
                   (size_type)in_stack_fffffffffffffd18);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd48);
        local_d8[0] = measurement_cast_from_string
                                (in_stack_fffffffffffffd70,
                                 CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
        std::__cxx11::string::~string(in_stack_fffffffffffffd10);
        local_100 = measurement::units(local_78);
        bVar1 = unit::operator==((unit *)in_stack_fffffffffffffd18,(unit *)in_stack_fffffffffffffd10
                                );
        if (bVar1) {
          val = measurement::value(local_78);
          uncertainty_val = measurement::value(local_d8);
          local_110 = measurement::units(local_d8);
          local_108 = unit_cast(&local_110);
          uncertain_measurement::uncertain_measurement(&local_10,val,uncertainty_val,&local_108);
        }
        else {
          local_11c = measurement::units(local_d8);
          bVar1 = unit::operator==((unit *)in_stack_fffffffffffffd18,
                                   (unit *)in_stack_fffffffffffffd10);
          if (bVar1) {
            measurement::value(local_d8);
            uncertain_measurement::uncertain_measurement
                      ((uncertain_measurement *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                       (double)in_stack_fffffffffffffd10);
          }
          else {
            uncertain_measurement::uncertain_measurement
                      (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                       (measurement *)in_stack_fffffffffffffd30);
          }
        }
        local_114 = 1;
        std::__cxx11::string::~string(in_stack_fffffffffffffd10);
        std::__cxx11::string::~string(in_stack_fffffffffffffd10);
        return local_10;
      }
      local_48 = 0xffffffffffffffff;
    }
    local_128 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffd10,in_stack_fffffffffffffd0f,0x6dc2df);
    if ((local_128 != 0xffffffffffffffff) && (1 < local_128)) {
      local_130 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffd10,in_stack_fffffffffffffd0f,0x6dc323);
      local_138 = local_130 - local_128;
      if ((1 < local_138) && (local_138 < 5)) {
        local_13c = (int)local_128 + -1;
        local_148 = local_130 - 1;
        pvVar2 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd10,
                            CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
        local_149 = *pvVar2;
        if (('/' < local_149) && (local_149 < ':')) {
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd48);
          for (; -1 < local_13c; local_13c = local_13c + -1) {
            pvVar2 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffd10,
                                CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
            local_149 = *pvVar2;
            if (('/' < local_149) && (local_149 < ':')) {
              if (local_128 < local_148) {
                pvVar2 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffd10,
                                    CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
                in_stack_fffffffffffffd57 = *pvVar2;
                pvVar3 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffd10,
                                    CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
                *pvVar3 = in_stack_fffffffffffffd57;
                local_148 = local_148 - 1;
              }
              else {
                in_stack_fffffffffffffd48 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffd10,
                                CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
                *(value_type *)&(in_stack_fffffffffffffd48->_M_dataplus)._M_p = '0';
              }
            }
          }
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd48);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase(in_stack_fffffffffffffd20,(size_type)in_stack_fffffffffffffd18,
                (size_type)in_stack_fffffffffffffd10);
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd48);
          mVar4 = measurement_cast_from_string
                            (in_stack_fffffffffffffd70,
                             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
          local_1a0 = mVar4;
          std::__cxx11::string::~string(in_stack_fffffffffffffd10);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase(in_stack_fffffffffffffd20,(size_type)in_stack_fffffffffffffd18,
                (size_type)in_stack_fffffffffffffd10);
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd48);
          mVar5 = measurement_cast_from_string
                            (in_stack_fffffffffffffd70,
                             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
          local_1d0 = mVar5;
          std::__cxx11::string::~string(in_stack_fffffffffffffd10);
          uncertain_measurement::uncertain_measurement
                    ((uncertain_measurement *)mVar4.value_,(measurement *)mVar4.units_,
                     (measurement *)mVar5.value_);
          local_114 = 1;
          std::__cxx11::string::~string(in_stack_fffffffffffffd10);
          std::__cxx11::string::~string(in_stack_fffffffffffffd10);
          return local_10;
        }
      }
    }
    this = &local_220;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd48);
    local_200 = measurement_cast_from_string
                          (in_stack_fffffffffffffd70,
                           CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    uncertain_measurement::uncertain_measurement
              ((uncertain_measurement *)local_200.value_,(measurement *)local_200.units_,
               (float)((ulong)this >> 0x20));
    std::__cxx11::string::~string(this);
  }
  return local_10;
}

Assistant:

uncertain_measurement uncertain_measurement_from_string(
    const std::string& measurement_string,
    std::uint64_t match_flags)
{
    if (measurement_string.empty()) {
        return {};
    }
    // first task is to find the +/-
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<const char*, 9> pmsequences{
        {"+/-",
         "\xB1",
         u8"\u00B1",
         "&plusmn;",
         "+-",
         "<u>+</u>",
         "&#xB1;",
         "&pm;",
         " \\pm "}};

    for (const auto* pmseq : pmsequences) {
        auto loc = measurement_string.find(pmseq);
        if (loc != std::string::npos) {
            auto p1 = measurement_string.substr(0, loc);
            auto m1 = measurement_cast_from_string(p1, match_flags);
            auto p2 = measurement_string.substr(loc + strlen(pmseq));
            auto m2 = measurement_cast_from_string(p2, match_flags);
            if (m1.units() == one) {
                return uncertain_measurement(
                    m1.value(), m2.value(), unit_cast(m2.units()));
            }
            if (m2.units() == one) {
                return uncertain_measurement(m1, m2.value());
            }
            return uncertain_measurement(m1, m2);
        }
    }
    // check for consise form of uncertainty X.XXXXXX(UU) N
    auto loc = measurement_string.find_first_of('(');
    if (loc < std::string::npos && loc > 1) {
        auto eloc = measurement_string.find_first_of(')', loc + 1);
        auto diff = eloc - loc;
        if (diff >= 2 && diff <= 4) {
            int cloc = static_cast<int>(loc) - 1;
            auto lc = eloc - 1;
            char c = measurement_string[cloc];
            if (c >= '0' && c <= '9') {
                auto ustring = measurement_string;
                while (cloc >= 0) {
                    c = measurement_string[cloc];
                    if (c >= '0' && c <= '9') {
                        if (lc > loc) {
                            ustring[cloc] = measurement_string[lc];
                            --lc;
                        } else {
                            ustring[cloc] = '0';
                        }
                    }
                    --cloc;
                }
                auto p = measurement_string;
                p.erase(loc, diff + 1);
                auto m1 = measurement_cast_from_string(p, match_flags);
                ustring.erase(loc, diff + 1);
                auto u1 = measurement_cast_from_string(ustring, match_flags);
                return uncertain_measurement(m1, u1);
            }
        }
    }
    return uncertain_measurement(
        measurement_cast_from_string(measurement_string, match_flags), 0.0F);
}